

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void collect_args_and_func_types(c2m_ctx_t c2m_ctx,func_type *func_type)

{
  node_code_t nVar1;
  gen_ctx_conflict *pgVar2;
  VARR_MIR_var_t *pVVar3;
  VARR_MIR_type_t *pVVar4;
  MIR_var_t obj;
  MIR_var_t obj_00;
  uint uVar5;
  MIR_type_t MVar6;
  MIR_type_t MVar7;
  int iVar8;
  node_t_conflict pnVar9;
  c2m_ctx_t pcVar10;
  ulong uVar11;
  type *ptVar12;
  node_t param;
  char *pcVar13;
  target_arg_info_t arg_info;
  MIR_type_t local_60 [2];
  c2m_ctx_t local_58;
  MIR_var_t var;
  
  pgVar2 = c2m_ctx->gen_ctx;
  pVVar3 = (pgVar2->proto_info).arg_vars;
  if ((pVVar3 == (VARR_MIR_var_t *)0x0) || (pVVar3->varr == (MIR_var_t *)0x0)) {
    mir_varr_assert_fail("trunc","MIR_var_t");
  }
  param = (func_type->param_list->u).ops.head;
  pVVar3->els_num = 0;
  pVVar4 = (pgVar2->proto_info).ret_types;
  if ((pVVar4 != (VARR_MIR_type_t *)0x0) && (pVVar4->varr != (MIR_type_t *)0x0)) {
    pVVar4->els_num = 0;
    (pgVar2->proto_info).res_ref_p = 0;
    arg_info.n_iregs = 0;
    arg_info.n_fregs = 0;
    local_58 = c2m_ctx;
    set_type_layout(c2m_ctx,func_type->ret_type);
    pcVar10 = local_58;
    ptVar12 = func_type->ret_type;
    pVVar4 = (pgVar2->proto_info).ret_types;
    pVVar3 = (pgVar2->proto_info).arg_vars;
    if ((ptVar12->mode != TM_BASIC) || ((ptVar12->u).basic_type != TP_VOID)) {
      uVar5 = process_ret_type(local_58,ptVar12,local_60);
      if (uVar5 == 0) {
        if ((ptVar12->mode & ~TM_BASIC) == TM_STRUCT) {
          var.name = "Ret_Addr";
          var.type = MIR_T_RBLK;
          var.size = type_size(pcVar10,ptVar12);
          obj._4_4_ = var._4_4_;
          obj.type = var.type;
          obj.name = var.name;
          obj.size = var.size;
          VARR_MIR_var_tpush(pVVar3,obj);
          arg_info.n_iregs = 1;
        }
        else {
          MVar7 = get_mir_type(pcVar10,ptVar12);
          VARR_MIR_type_tpush(pVVar4,MVar7);
        }
      }
      else {
        for (uVar11 = 0; (~((int)uVar5 >> 0x1f) & uVar5) != uVar11; uVar11 = uVar11 + 1) {
          MVar7 = local_60[uVar11];
          MVar6 = MVar7 & ~MIR_T_I16;
          if (MVar6 == MIR_T_U8) {
            MVar7 = MIR_T_U32;
          }
          if (MVar6 == MIR_T_I8) {
            MVar7 = MIR_T_I32;
          }
          VARR_MIR_type_tpush(pVVar4,MVar7);
        }
      }
    }
    if ((param != (node_t_conflict)0x0) && (iVar8 = void_param_p(param), iVar8 == 0)) {
      for (; param != (node_t_conflict)0x0; param = (param->op_link).next) {
        nVar1 = param->code;
        if (nVar1 == N_TYPE) {
          pcVar13 = "p";
          ptVar12 = *(type **)((long)param->attr + 0x18);
          pcVar10 = local_58;
        }
        else {
          pnVar9 = DLIST_node_t_el(&(param->u).ops,1);
          pcVar10 = local_58;
          if (((nVar1 != N_SPEC_DECL) || (pnVar9 == (node_t_conflict)0x0)) ||
             (pnVar9->code != N_DECL)) {
            __assert_fail("p->code == N_SPEC_DECL && declarator != NULL && declarator->code == N_DECL"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x2c94,"void collect_args_and_func_types(c2m_ctx_t, struct func_type *)")
            ;
          }
          ptVar12 = *(type **)((long)param->attr + 0x40);
          pcVar13 = get_param_name(local_58,ptVar12,(((pnVar9->u).ops.head)->u).s.s);
        }
        pVVar3 = (pgVar2->proto_info).arg_vars;
        iVar8 = process_aggregate_arg(pcVar10,ptVar12,&arg_info,local_60);
        var.name = pcVar13;
        if ((ptVar12->mode & ~TM_BASIC) == TM_STRUCT) {
          var.type = get_blk_type(iVar8,local_60);
          var.size = type_size(pcVar10,ptVar12);
        }
        else {
          var.type = get_mir_type(pcVar10,ptVar12);
          if ((var.type & 0x1e) == MIR_T_F) {
            arg_info.n_fregs = arg_info.n_fregs + 1;
          }
          else if (var.type != MIR_T_LD) {
            arg_info.n_iregs = arg_info.n_iregs + 1;
          }
        }
        obj_00._4_4_ = var._4_4_;
        obj_00.type = var.type;
        obj_00.name = var.name;
        obj_00.size = var.size;
        VARR_MIR_var_tpush(pVVar3,obj_00);
      }
    }
    return;
  }
  mir_varr_assert_fail("trunc","MIR_type_t");
}

Assistant:

static void collect_args_and_func_types (c2m_ctx_t c2m_ctx, struct func_type *func_type) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  node_t declarator, id, first_param, p;
  struct type *param_type;
  decl_t param_decl;
  const char *name;
  target_arg_info_t arg_info;

  first_param = NL_HEAD (func_type->param_list->u.ops);
  VARR_TRUNC (MIR_var_t, proto_info.arg_vars, 0);
  VARR_TRUNC (MIR_type_t, proto_info.ret_types, 0);
  proto_info.res_ref_p = FALSE;
  target_init_arg_vars (c2m_ctx, &arg_info);
  set_type_layout (c2m_ctx, func_type->ret_type);
  target_add_res_proto (c2m_ctx, func_type->ret_type, &arg_info, proto_info.ret_types,
                        proto_info.arg_vars);
  if (first_param != NULL && !void_param_p (first_param)) {
    for (p = first_param; p != NULL; p = NL_NEXT (p)) {
      if (p->code == N_TYPE) {
        name = "p";
        param_type = ((struct decl_spec *) p->attr)->type;
        param_decl = NULL;
      } else {
        declarator = NL_EL (p->u.ops, 1);
        assert (p->code == N_SPEC_DECL && declarator != NULL && declarator->code == N_DECL);
        id = NL_HEAD (declarator->u.ops);
        param_decl = p->attr;
        param_type = param_decl->decl_spec.type;
        name = get_param_name (c2m_ctx, param_type, id->u.s.s);
      }
      target_add_arg_proto (c2m_ctx, name, param_type, &arg_info, proto_info.arg_vars);
    }
  }
}